

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::X<double>
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZFMatrix<double> *coord,TPZVec<double> *xi,
          TPZVec<double> *result)

{
  bool bVar1;
  MElementType elType;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  int iNode;
  long lVar5;
  double row;
  long lVar6;
  TPZGeoBlend<pzgeom::TPZGeoPyramid> *pTVar7;
  int x_1;
  int x_2;
  int x;
  long lVar8;
  double dVar9;
  int side_1;
  double local_a80;
  TPZGeoBlend<pzgeom::TPZGeoPyramid> *local_a78;
  double local_a70;
  int subSide;
  double blendFactorSide;
  TPZVec<double> *local_a58;
  TPZGeoMesh *local_a50;
  double local_a48;
  TPZFMatrix<double> *local_a40;
  TPZGeoElSideIndex *local_a38;
  TPZVec<double> *local_a30;
  TPZGeoElSide gelside;
  TPZManVector<bool,_20> isRegularMapping;
  TPZManVector<double,_3> projectedPoint;
  TPZManVector<double,_3> Xside;
  TPZManVector<double,_3> nodeCoord;
  TPZManVector<double,_3> notUsedHereVec;
  TPZStack<int,_10> containedNodesInSide;
  TPZManVector<double,_3> sideXi;
  TPZStack<int,_10> allContainedSides;
  TPZFNMatrix<27,_double> projectedPointOverSide;
  TPZGeoElSide neighbour;
  TPZManVector<double,_3> neighXi_1;
  TPZFNMatrix<9,_double> notUsedHereMat;
  TPZManVector<double,_20> blendFactor;
  TPZFNMatrix<27,_double> linearSideMappings;
  TPZFNMatrix<9,_double> phi;
  TPZFNMatrix<27,_double> nonLinearSideMappings;
  TPZFNMatrix<9,_double> sidePhi;
  
  local_a40 = coord;
  if (this->fGeoEl == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1f6);
  }
  local_a50 = this->fGeoEl->fMesh;
  projectedPointOverSide.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  local_a78 = this;
  TPZManVector<double,_3>::TPZManVector(&notUsedHereVec,3,(double *)&projectedPointOverSide);
  projectedPointOverSide.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&notUsedHereMat,0x13,0x13,(double *)&projectedPointOverSide);
  (*result->_vptr_TPZVec[3])(result,3);
  projectedPointOverSide.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZVec<double>::Fill(result,(double *)&projectedPointOverSide,0,-1);
  pTVar7 = local_a78;
  if (local_a78->fNeighbours[0xd].fGeoElIndex == -1) {
    TPZFNMatrix<9,_double>::TPZFNMatrix(&phi,5,1);
    pztopology::TPZPyramid::TShape<double>
              (xi,&phi.super_TPZFMatrix<double>,&notUsedHereMat.super_TPZFMatrix<double>);
    local_a38 = pTVar7->fNeighbours;
    for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        pdVar4 = TPZFMatrix<double>::operator()(local_a40,lVar8,lVar5);
        local_a80 = *pdVar4;
        pdVar4 = TPZFMatrix<double>::operator()(&phi.super_TPZFMatrix<double>,lVar5,0);
        result->fStore[lVar8] = local_a80 * *pdVar4 + result->fStore[lVar8];
      }
    }
    projectedPointOverSide.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable =
         projectedPointOverSide.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
         .super_TPZSavable._vptr_TPZSavable & 0xffffffffffffff00;
    TPZManVector<bool,_20>::TPZManVector(&isRegularMapping,0xe,(bool *)&projectedPointOverSide);
    for (lVar5 = -0xd; lVar5 != 0; lVar5 = lVar5 + 1) {
      projectedPointOverSide.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable._0_4_ = (int)lVar5 + 0x12;
      bVar1 = pztopology::TPZPyramid::CheckProjectionForSingularity<double>
                        ((int *)&projectedPointOverSide,xi);
      isRegularMapping.super_TPZVec<bool>.fStore[lVar5 + 0xd] = bVar1;
    }
    projectedPointOverSide.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZManVector<double,_20>::TPZManVector(&blendFactor,0xe,(double *)&projectedPointOverSide);
    linearSideMappings.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              (&projectedPointOverSide,0xe,3,(double *)&linearSideMappings);
    pTVar7 = local_a78;
    nonLinearSideMappings.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<27,_double>::TPZFNMatrix(&linearSideMappings,0xe,3,(double *)&nonLinearSideMappings)
    ;
    sidePhi.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)0x0;
    local_a58 = xi;
    local_a30 = result;
    TPZFNMatrix<27,_double>::TPZFNMatrix(&nonLinearSideMappings,0xe,3,(double *)&sidePhi);
    for (lVar5 = 0; lVar5 != 0xd; lVar5 = lVar5 + 1) {
      side_1 = (int)lVar5 + 5;
      if (isRegularMapping.super_TPZVec<bool>.fStore[lVar5] == true) {
        TPZGeoElSide::TPZGeoElSide(&gelside,local_a38 + lVar5,local_a50);
        bVar1 = IsLinearMapping(pTVar7,side_1);
        if (((bVar1) || (gelside.fGeoEl == (TPZGeoEl *)0x0)) || (gelside.fSide < 0)) {
          blendFactor.super_TPZVec<double>.fStore[lVar5] = 0.0;
        }
        else {
          TPZManVector<double,_3>::TPZManVector(&sideXi,0);
          pztopology::TPZPyramid::MapToSide<double>
                    (side_1,local_a58,&sideXi.super_TPZVec<double>,
                     &notUsedHereMat.super_TPZFMatrix<double>);
          elType = pztopology::TPZPyramid::Type(side_1);
          uVar2 = MElementType_NNodes(elType);
          TPZFNMatrix<9,_double>::TPZFNMatrix(&sidePhi,(long)(int)uVar2,1);
          TPZFMatrix<double>::Resize(&notUsedHereMat.super_TPZFMatrix<double>,3,(long)(int)uVar2);
          GetSideShapeFunction<pzgeom::TPZGeoPyramid>
                    (side_1,&sideXi.super_TPZVec<double>,&sidePhi.super_TPZFMatrix<double>,
                     &notUsedHereMat.super_TPZFMatrix<double>);
          TPZManVector<double,_3>::TPZManVector(&nodeCoord,0);
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          dVar9 = (double)(ulong)uVar2;
          local_a48 = dVar9;
          for (row = 0.0; row != dVar9; row = (double)((long)row + 1)) {
            iVar3 = pztopology::TPZPyramid::SideNodeLocId(side_1,SUB84(row,0));
            for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
              pdVar4 = TPZFMatrix<double>::operator()(local_a40,lVar8,(long)iVar3);
              local_a80 = *pdVar4;
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&sidePhi.super_TPZFMatrix<double>,(int64_t)row,0);
              local_a70 = *pdVar4;
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&linearSideMappings.super_TPZFMatrix<double>,lVar5,lVar8);
              *pdVar4 = local_a80 * local_a70 + *pdVar4;
            }
            pztopology::TPZPyramid::ParametricDomainNodeCoord(iVar3,&nodeCoord.super_TPZVec<double>)
            ;
            dVar9 = local_a48;
            for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
              local_a80 = nodeCoord.super_TPZVec<double>.fStore[lVar8];
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&sidePhi.super_TPZFMatrix<double>,(int64_t)row,0);
              local_a70 = *pdVar4;
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&projectedPointOverSide.super_TPZFMatrix<double>,lVar5,lVar8);
              *pdVar4 = local_a80 * local_a70 + *pdVar4;
            }
          }
          pztopology::TPZPyramid::BlendFactorForSide<double>
                    (&side_1,local_a58,blendFactor.super_TPZVec<double>.fStore + lVar5,
                     &notUsedHereVec.super_TPZVec<double>);
          iVar3 = TPZGeoElSide::Dimension(&gelside);
          TPZManVector<double,_3>::TPZManVector(&neighXi_1,0);
          bVar1 = MapToNeighSide<double>
                            (local_a78,side_1,iVar3,local_a58,&neighXi_1.super_TPZVec<double>,
                             &notUsedHereMat.super_TPZFMatrix<double>);
          pTVar7 = local_a78;
          if (bVar1) {
            containedNodesInSide.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)0x0;
            TPZManVector<double,_3>::TPZManVector(&Xside,3,(double *)&containedNodesInSide);
            Neighbour(&neighbour,pTVar7,side_1,local_a50);
            TPZGeoElSide::X(&neighbour,&neighXi_1.super_TPZVec<double>,&Xside.super_TPZVec<double>);
            for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
              local_a80 = Xside.super_TPZVec<double>.fStore[lVar8];
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&nonLinearSideMappings.super_TPZFMatrix<double>,lVar5,lVar8);
              *pdVar4 = local_a80;
            }
            TPZStack<int,_10>::TPZStack(&containedNodesInSide);
            pztopology::TPZPyramid::LowerDimensionSides(side_1,&containedNodesInSide,0);
            pTVar7 = local_a78;
            TPZStack<int,_10>::TPZStack(&allContainedSides);
            pztopology::TPZPyramid::LowerDimensionSides(side_1,&allContainedSides);
            for (lVar8 = (long)(int)containedNodesInSide.super_TPZManVector<int,_10>.
                                    super_TPZVec<int>.fNElements;
                lVar8 < allContainedSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
                lVar8 = lVar8 + 1) {
              subSide = allContainedSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore
                        [lVar8];
              if (isRegularMapping.super_TPZVec<bool>.fStore[(long)subSide + -5] != false) {
                bVar1 = IsLinearMapping(pTVar7,subSide);
                if (!bVar1) {
                  blendFactorSide = -1.0;
                  TPZManVector<double,_3>::TPZManVector(&projectedPoint,3,&blendFactorSide);
                  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                    pdVar4 = TPZFMatrix<double>::operator()
                                       (&projectedPointOverSide.super_TPZFMatrix<double>,lVar5,lVar6
                                       );
                    projectedPoint.super_TPZVec<double>.fStore[lVar6] = *pdVar4;
                  }
                  blendFactorSide = -1.0;
                  pztopology::TPZPyramid::BlendFactorForSide<double>
                            (&subSide,&projectedPoint.super_TPZVec<double>,&blendFactorSide,
                             &notUsedHereVec.super_TPZVec<double>);
                  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                    local_a80 = blendFactorSide;
                    pdVar4 = TPZFMatrix<double>::operator()
                                       (&nonLinearSideMappings.super_TPZFMatrix<double>,
                                        (long)subSide + -5,lVar6);
                    local_a70 = *pdVar4;
                    pdVar4 = TPZFMatrix<double>::operator()
                                       (&linearSideMappings.super_TPZFMatrix<double>,
                                        (long)subSide + -5,lVar6);
                    local_a48 = *pdVar4;
                    pdVar4 = TPZFMatrix<double>::operator()
                                       (&nonLinearSideMappings.super_TPZFMatrix<double>,lVar5,lVar6)
                    ;
                    *pdVar4 = *pdVar4 - local_a80 * (local_a70 - local_a48);
                  }
                  TPZManVector<double,_3>::~TPZManVector(&projectedPoint);
                  pTVar7 = local_a78;
                }
              }
            }
            for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
              local_a80 = blendFactor.super_TPZVec<double>.fStore[lVar5];
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&nonLinearSideMappings.super_TPZFMatrix<double>,lVar5,lVar8);
              local_a70 = *pdVar4;
              pdVar4 = TPZFMatrix<double>::operator()
                                 (&linearSideMappings.super_TPZFMatrix<double>,lVar5,lVar8);
              local_a30->fStore[lVar8] =
                   local_a80 * (local_a70 - *pdVar4) + local_a30->fStore[lVar8];
            }
            TPZManVector<int,_10>::~TPZManVector(&allContainedSides.super_TPZManVector<int,_10>);
            TPZManVector<int,_10>::~TPZManVector(&containedNodesInSide.super_TPZManVector<int,_10>);
            TPZManVector<double,_3>::~TPZManVector(&Xside);
          }
          pTVar7 = local_a78;
          TPZManVector<double,_3>::~TPZManVector(&neighXi_1);
          TPZManVector<double,_3>::~TPZManVector(&nodeCoord);
          TPZFNMatrix<9,_double>::~TPZFNMatrix(&sidePhi);
          TPZManVector<double,_3>::~TPZManVector(&sideXi);
        }
      }
    }
    TPZFNMatrix<27,_double>::~TPZFNMatrix(&nonLinearSideMappings);
    TPZFNMatrix<27,_double>::~TPZFNMatrix(&linearSideMappings);
    TPZFNMatrix<27,_double>::~TPZFNMatrix(&projectedPointOverSide);
    TPZManVector<double,_20>::~TPZManVector(&blendFactor);
    TPZManVector<bool,_20>::~TPZManVector(&isRegularMapping);
    TPZFNMatrix<9,_double>::~TPZFNMatrix(&phi);
  }
  else {
    TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)&projectedPointOverSide,0);
    bVar1 = MapToNeighSide<double>
                      (pTVar7,0x12,3,xi,(TPZVec<double> *)&projectedPointOverSide,
                       &notUsedHereMat.super_TPZFMatrix<double>);
    if (!bVar1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
                 ,0x215);
    }
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)&linearSideMappings,pTVar7->fNeighbours + 0xd,local_a50);
    TPZGeoElSide::X((TPZGeoElSide *)&linearSideMappings,(TPZVec<double> *)&projectedPointOverSide,
                    result);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&projectedPointOverSide);
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&notUsedHereMat);
  TPZManVector<double,_3>::~TPZManVector(&notUsedHereVec);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::X(TPZFMatrix<REAL> &coord, TPZVec<T> &xi, TPZVec<T> &result) const {
//    TPZGeoEl &gel = *fGeoEl;
    if(!fGeoEl) DebugStop();
    TPZGeoMesh *gmesh = fGeoEl->Mesh();
    TPZManVector<T,3> notUsedHereVec(3,(T)0);
    TPZFNMatrix<9,T> notUsedHereMat(TGeo::NSides, TGeo::NSides,(T)0);//since some methods dont resize the matrix, it is
    // bigger than needed.

    #ifdef PZ_LOG
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::X2_______REF_1"<<std::endl;
        soutLogDebug << "element id " <<fGeoEl->Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xi.size(); i++) soutLogDebug<<xi[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif
    const REAL zero = 1e-14;
    result.Resize(3);
    result.Fill(0);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        Neighbour(TGeo::NSides-1, gmesh).X(neighXi, result);
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1);
    TGeo::TShape(xi, phi, notUsedHereMat);//gets the barycentric coordinates


    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for (int x = 0; x < 3; x++) {
            result[x] += coord(x, iNode) * phi(iNode, 0);
        }
    }
    #ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "Linear mapping:\n"<<std::endl;
        for(int i = 0; i < result.size(); i++) soutLogDebug<<result[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif

    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */
    TPZManVector<bool, 20> isRegularMapping(TGeo::NSides - TGeo::NNodes, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        isRegularMapping[sideIndex] = TGeo::CheckProjectionForSingularity(side,xi);
    }

    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, 0.);
    TPZFNMatrix<27, T> projectedPointOverSide(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, 0.);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        if(!isRegularMapping[sideIndex]) {
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                soutLogDebug <<"mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            soutLogDebug << "================================" <<std::endl;
            soutLogDebug << "side: "<<side<<" is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                if( IsLinearMapping(side) )  soutLogDebug <<"true"<<std::endl;
                else    soutLogDebug <<"false (no gelside) "<<std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"false (gelside exists) "<<std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3>  sideXi;
        this->MapToSide(side, xi, sideXi, notUsedHereMat);

        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        TPZFNMatrix<9, T> sidePhi(nSideNodes, 1);
        notUsedHereMat.Resize(TGeo::Dimension,nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhi, notUsedHereMat);

        TPZManVector<REAL,3> nodeCoord;
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhi(iNode, 0);
            }
            TGeo::ParametricDomainNodeCoord(currentNode,nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPointOverSide(sideIndex,x) += nodeCoord[x] * sidePhi(iNode,0);
            }
        }
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"xi projection over side:\n";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug<<projectedPointOverSide(sideIndex,x)<<"\n";
            soutLogDebug<<std::endl<<"xi projection in side domain:\n";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug<<sideXi[x]<<"\n";
            soutLogDebug<<std::endl<<"linear mapping of projected point:\n";
            for (int x = 0; x < 3; x++) soutLogDebug<<linearSideMappings(sideIndex, x)<<"\n";
        }
        #endif

        TGeo::BlendFactorForSide(side, xi, blendFactor[sideIndex], notUsedHereVec);
        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(side, sidedim, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        TPZGeoElSide neighbour = Neighbour(side, gmesh);
        neighbour.X(neighXi, Xside);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if(!isRegularMapping[subSide - TGeo::NNodes]) {
                #ifdef PZ_LOG
                if(logger.isDebugEnabled()){
                    soutLogDebug <<"mapping of subside is not regular. skipping side... ";

                }
                #endif
                continue;
            }
            if (IsLinearMapping(subSide)) continue;
            TPZManVector<T, 3> projectedPoint(TGeo::Dimension, -1);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPoint[x] = projectedPointOverSide(sideIndex, x);
            }

            T blendFactorSide = -1;
            TGeo::BlendFactorForSide(subSide, projectedPoint, blendFactorSide,notUsedHereVec);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
            }

        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping\n";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\n";
            soutLogDebug << std::endl;

            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tblend factor: " << blendFactor[sideIndex] << std::endl;
//            LOGPZ_DEBUG(logger,soutLogDebug.str())
//            soutLogDebug.str("");
        }
#endif
        for (int x = 0; x < 3; x++) {
            result[x] += blendFactor[sideIndex] *
                         (nonLinearSideMappings(sideIndex, x) - linearSideMappings(sideIndex, x));
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for (int x = 0; x < 3; x++) soutLogDebug<<result[x]<<"\n";
        soutLogDebug << "\n================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
}